

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall
ProblemTest_Complementarity_Test::~ProblemTest_Complementarity_Test
          (ProblemTest_Complementarity_Test *this)

{
  void *in_RDI;
  
  ~ProblemTest_Complementarity_Test((ProblemTest_Complementarity_Test *)0x13b958);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ProblemTest, Complementarity) {
  Problem p;
  EXPECT_FALSE(p.HasComplementarity());
  p.AddVar(0, 1);
  p.AddCon(0, 1);
  using mp::ComplInfo;
  p.SetComplementarity(0, 0, ComplInfo(0));
  EXPECT_TRUE(p.HasComplementarity());
  EXPECT_ASSERT(p.SetComplementarity(-1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, -1, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, 1, ComplInfo(0)), "invalid index");
}